

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_value(yaml_parser_t *parser)

{
  yaml_simple_key_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  yaml_token_t *__dest;
  int iVar7;
  int local_ac;
  int local_a8;
  int local_a4;
  yaml_simple_key_t *simple_key;
  yaml_token_t token;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_parser_t *parser_local;
  
  pyVar1 = (parser->simple_keys).top;
  if (pyVar1[-1].possible == 0) {
    if (parser->flow_level == 0) {
      if (parser->simple_key_allowed == 0) {
        iVar7 = yaml_parser_set_scanner_error
                          (parser,(char *)0x0,parser->mark,
                           "mapping values are not allowed in this context");
        return iVar7;
      }
      iVar7 = yaml_parser_roll_indent
                        (parser,(parser->mark).column,-1,YAML_BLOCK_MAPPING_START_TOKEN,parser->mark
                        );
      if (iVar7 == 0) {
        return 0;
      }
    }
    parser->simple_key_allowed = (uint)((parser->flow_level != 0 ^ 0xffU) & 1);
  }
  else {
    memset(&simple_key,0,0x50);
    simple_key._0_4_ = 0x10;
    token.data._16_8_ = pyVar1[-1].mark.index;
    token.start_mark.index = pyVar1[-1].mark.line;
    token.start_mark.line = pyVar1[-1].mark.column;
    token.start_mark.column = pyVar1[-1].mark.index;
    token.end_mark.index = pyVar1[-1].mark.line;
    token.end_mark.line = pyVar1[-1].mark.column;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar7 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                  &(parser->tokens).tail,&(parser->tokens).end), iVar7 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    memmove((parser->tokens).head + (pyVar1[-1].token_number - parser->tokens_parsed) + 1,
            (parser->tokens).head + (pyVar1[-1].token_number - parser->tokens_parsed),
            (((long)(parser->tokens).tail - (long)(parser->tokens).head) / 0x50 -
            (pyVar1[-1].token_number - parser->tokens_parsed)) * 0x50);
    memcpy((parser->tokens).head + (pyVar1[-1].token_number - parser->tokens_parsed),&simple_key,
           0x50);
    (parser->tokens).tail = (parser->tokens).tail + 1;
    iVar7 = yaml_parser_roll_indent
                      (parser,pyVar1[-1].mark.column,pyVar1[-1].token_number,
                       YAML_BLOCK_MAPPING_START_TOKEN,pyVar1[-1].mark);
    if (iVar7 == 0) {
      return 0;
    }
    pyVar1[-1].possible = 0;
    parser->simple_key_allowed = 0;
  }
  sVar2 = (parser->mark).index;
  sVar3 = (parser->mark).line;
  sVar4 = (parser->mark).column;
  (parser->mark).index = (parser->mark).index + 1;
  (parser->mark).column = (parser->mark).column + 1;
  parser->unread = parser->unread - 1;
  if ((*(parser->buffer).pointer & 0x80) == 0) {
    local_a4 = 1;
  }
  else {
    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
      local_a8 = 2;
    }
    else {
      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
        local_ac = 3;
      }
      else {
        local_ac = 0;
        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          local_ac = 4;
        }
      }
      local_a8 = local_ac;
    }
    local_a4 = local_a8;
  }
  (parser->buffer).pointer = (parser->buffer).pointer + local_a4;
  token.end_mark.column = (parser->mark).index;
  sVar5 = (parser->mark).line;
  sVar6 = (parser->mark).column;
  memset(&simple_key,0,0x50);
  simple_key._0_4_ = 0x11;
  token.start_mark.column = token.end_mark.column;
  token.data._16_8_ = sVar2;
  token.start_mark.index = sVar3;
  token.start_mark.line = sVar4;
  token.end_mark.index = sVar5;
  token.end_mark.line = sVar6;
  if (((parser->tokens).tail == (parser->tokens).end) &&
     (iVar7 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                &(parser->tokens).tail,&(parser->tokens).end), iVar7 == 0)) {
    parser->error = YAML_MEMORY_ERROR;
    parser_local._4_4_ = 0;
  }
  else {
    __dest = (parser->tokens).tail;
    (parser->tokens).tail = __dest + 1;
    memcpy(__dest,&simple_key,0x50);
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_value(yaml_parser_t *parser)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;
    yaml_simple_key_t *simple_key = parser->simple_keys.top-1;

    /* Have we found a simple key? */

    if (simple_key->possible)
    {

        /* Create the KEY token and insert it into the queue. */

        TOKEN_INIT(token, YAML_KEY_TOKEN, simple_key->mark, simple_key->mark);

        if (!QUEUE_INSERT(parser, parser->tokens,
                    simple_key->token_number - parser->tokens_parsed, token))
            return 0;

        /* In the block context, we may need to add the BLOCK-MAPPING-START token. */

        if (!yaml_parser_roll_indent(parser, simple_key->mark.column,
                    simple_key->token_number,
                    YAML_BLOCK_MAPPING_START_TOKEN, simple_key->mark))
            return 0;

        /* Remove the simple key. */

        simple_key->possible = 0;

        /* A simple key cannot follow another simple key. */

        parser->simple_key_allowed = 0;
    }
    else
    {
        /* The ':' indicator follows a complex key. */

        /* In the block context, extra checks are required. */

        if (!parser->flow_level)
        {
            /* Check if we are allowed to start a complex value. */

            if (!parser->simple_key_allowed) {
                return yaml_parser_set_scanner_error(parser, NULL, parser->mark,
                        "mapping values are not allowed in this context");
            }

            /* Add the BLOCK-MAPPING-START token if needed. */

            if (!yaml_parser_roll_indent(parser, parser->mark.column, -1,
                        YAML_BLOCK_MAPPING_START_TOKEN, parser->mark))
                return 0;
        }

        /* Simple keys after ':' are allowed in the block context. */

        parser->simple_key_allowed = (!parser->flow_level);
    }

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the VALUE token and append it to the queue. */

    TOKEN_INIT(token, YAML_VALUE_TOKEN, start_mark, end_mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}